

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_ExpressionNot_x_iutest_x_Comparison_Test::Body(iu_ExpressionNot_x_iutest_x_Comparison_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1450;
  AssertionHelper local_1430;
  Fixed local_1400;
  bool local_1273;
  bool local_1272;
  ExpressionDecomposer local_1271;
  ExpressionLHS<bool> local_1270;
  ExpressionResult local_1248;
  AssertionResult local_1220;
  undefined1 local_11f8 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_11b0;
  Fixed local_1180;
  bool local_ff3;
  bool local_ff2;
  ExpressionDecomposer local_ff1;
  ExpressionLHS<bool> local_ff0;
  ExpressionResult local_fc8;
  AssertionResult local_fa0;
  undefined1 local_f78 [8];
  AssertionResult iutest_ar_6;
  AssertionHelper local_f30;
  Fixed local_f00;
  int local_d74;
  int local_d70;
  ExpressionDecomposer local_d69;
  ExpressionLHS<int> local_d68;
  ExpressionResult local_d40;
  AssertionResult local_d18;
  undefined1 local_cf0 [8];
  AssertionResult iutest_ar_5;
  AssertionHelper local_ca8;
  Fixed local_c78;
  int local_aec;
  int local_ae8;
  ExpressionDecomposer local_ae1;
  ExpressionLHS<int> local_ae0;
  ExpressionResult local_ab8;
  AssertionResult local_a90;
  undefined1 local_a68 [8];
  AssertionResult iutest_ar_4;
  AssertionHelper local_a20;
  Fixed local_9f0;
  int local_864;
  int local_860;
  ExpressionDecomposer local_859;
  ExpressionLHS<int> local_858;
  ExpressionResult local_830;
  AssertionResult local_808;
  undefined1 local_7e0 [8];
  AssertionResult iutest_ar_3;
  AssertionHelper local_798;
  Fixed local_768;
  int local_5dc;
  int local_5d8;
  ExpressionDecomposer local_5d1;
  ExpressionLHS<int> local_5d0;
  ExpressionResult local_5a8;
  AssertionResult local_580;
  undefined1 local_558 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_510;
  Fixed local_4e0;
  int local_354;
  int local_350;
  ExpressionDecomposer local_349;
  ExpressionLHS<int> local_348;
  ExpressionResult local_320;
  AssertionResult local_2f8;
  undefined1 local_2d0 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_288;
  Fixed local_258;
  int local_bc;
  int local_b8;
  ExpressionDecomposer local_b1;
  ExpressionLHS<int> local_b0;
  ExpressionResult local_88;
  AssertionResult local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_ExpressionNot_x_iutest_x_Comparison_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_b8 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_b0,&local_b1,&local_b8);
  local_bc = 0x29;
  iutest::detail::ExpressionLHS<int>::operator==(&local_88,&local_b0,&local_bc);
  iutest::detail::ExpressionResult::GetResult(&local_60,&local_88,false);
  iutest::AssertionResult::Is((AssertionResult *)local_38,&local_60);
  iutest::AssertionResult::~AssertionResult(&local_60);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_88);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_b0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_258,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_258);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_1.m_result,(internal *)local_38,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 41))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x68,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_288,&local_258);
    iutest::AssertionHelper::~AssertionHelper(&local_288);
    std::__cxx11::string::~string((string *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_258);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_350 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_348,&local_349,&local_350);
  local_354 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_320,&local_348,&local_354);
  iutest::detail::ExpressionResult::GetResult(&local_2f8,&local_320,false);
  iutest::AssertionResult::Is((AssertionResult *)local_2d0,&local_2f8);
  iutest::AssertionResult::~AssertionResult(&local_2f8);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_320);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_348);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    memset(&local_4e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_4e0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_2.m_result,(internal *)local_2d0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 42))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_510,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x69,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_510,&local_4e0);
    iutest::AssertionHelper::~AssertionHelper(&local_510);
    std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_4e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  iutest::detail::AlwaysZero();
  local_5d8 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_5d0,&local_5d1,&local_5d8);
  local_5dc = 0x29;
  iutest::detail::ExpressionLHS<int>::operator<=(&local_5a8,&local_5d0,&local_5dc);
  iutest::detail::ExpressionResult::GetResult(&local_580,&local_5a8,false);
  iutest::AssertionResult::Is((AssertionResult *)local_558,&local_580);
  iutest::AssertionResult::~AssertionResult(&local_580);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_5a8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_5d0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    memset(&local_768,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_768);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_3.m_result,(internal *)local_558,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() <= 41))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_798,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_798,&local_768);
    iutest::AssertionHelper::~AssertionHelper(&local_798);
    std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_768);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  iutest::detail::AlwaysZero();
  local_860 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_858,&local_859,&local_860);
  local_864 = 0x2b;
  iutest::detail::ExpressionLHS<int>::operator>=(&local_830,&local_858,&local_864);
  iutest::detail::ExpressionResult::GetResult(&local_808,&local_830,false);
  iutest::AssertionResult::Is((AssertionResult *)local_7e0,&local_808);
  iutest::AssertionResult::~AssertionResult(&local_808);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_830);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_858);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    memset(&local_9f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9f0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_4.m_result,(internal *)local_7e0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() >= 43))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_a20,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6b,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_a20,&local_9f0);
    iutest::AssertionHelper::~AssertionHelper(&local_a20);
    std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  iutest::detail::AlwaysZero();
  local_ae8 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_ae0,&local_ae1,&local_ae8);
  local_aec = 0x28;
  iutest::detail::ExpressionLHS<int>::operator<(&local_ab8,&local_ae0,&local_aec);
  iutest::detail::ExpressionResult::GetResult(&local_a90,&local_ab8,false);
  iutest::AssertionResult::Is((AssertionResult *)local_a68,&local_a90);
  iutest::AssertionResult::~AssertionResult(&local_a90);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_ab8);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_ae0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    memset(&local_c78,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_c78);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_5.m_result,(internal *)local_a68,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() < 40))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_ca8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_ca8,&local_c78);
    iutest::AssertionHelper::~AssertionHelper(&local_ca8);
    std::__cxx11::string::~string((string *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_c78);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  iutest::detail::AlwaysZero();
  local_d70 = f();
  iutest::detail::ExpressionDecomposer::operator->*(&local_d68,&local_d69,&local_d70);
  local_d74 = 0x32;
  iutest::detail::ExpressionLHS<int>::operator>(&local_d40,&local_d68,&local_d74);
  iutest::detail::ExpressionResult::GetResult(&local_d18,&local_d40,false);
  iutest::AssertionResult::Is((AssertionResult *)local_cf0,&local_d18);
  iutest::AssertionResult::~AssertionResult(&local_d18);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_d40);
  iutest::detail::ExpressionLHS<int>::~ExpressionLHS(&local_d68);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf0);
  if (!bVar1) {
    memset(&local_f00,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_f00);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_6.m_result,(internal *)local_cf0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() > 50))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_f30,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_f30,&local_f00);
    iutest::AssertionHelper::~AssertionHelper(&local_f30);
    std::__cxx11::string::~string((string *)&iutest_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_f00);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_cf0);
  iutest::detail::AlwaysZero();
  local_ff2 = g();
  iutest::detail::ExpressionDecomposer::operator->*(&local_ff0,&local_ff1,&local_ff2);
  local_ff3 = true;
  iutest::detail::ExpressionLHS<bool>::operator&&(&local_fc8,&local_ff0,&local_ff3);
  iutest::detail::ExpressionResult::GetResult(&local_fa0,&local_fc8,false);
  iutest::AssertionResult::Is((AssertionResult *)local_f78,&local_fa0);
  iutest::AssertionResult::~AssertionResult(&local_fa0);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_fc8);
  iutest::detail::ExpressionLHS<bool>::~ExpressionLHS(&local_ff0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f78);
  if (!bVar1) {
    memset(&local_1180,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1180);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&iutest_ar_7.m_result,(internal *)local_f78,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((g() && true))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_11b0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6e,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_11b0,&local_1180);
    iutest::AssertionHelper::~AssertionHelper(&local_11b0);
    std::__cxx11::string::~string((string *)&iutest_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1180);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f78);
  iutest::detail::AlwaysZero();
  local_1272 = g();
  iutest::detail::ExpressionDecomposer::operator->*(&local_1270,&local_1271,&local_1272);
  local_1273 = false;
  iutest::detail::ExpressionLHS<bool>::operator||(&local_1248,&local_1270,&local_1273);
  iutest::detail::ExpressionResult::GetResult(&local_1220,&local_1248,false);
  iutest::AssertionResult::Is((AssertionResult *)local_11f8,&local_1220);
  iutest::AssertionResult::~AssertionResult(&local_1220);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_1248);
  iutest::detail::ExpressionLHS<bool>::~ExpressionLHS(&local_1270);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11f8);
  if (!bVar1) {
    memset(&local_1400,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1400);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1450,(internal *)local_11f8,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((g() || false))","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_1430,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0x6f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_1430,&local_1400);
    iutest::AssertionHelper::~AssertionHelper(&local_1430);
    std::__cxx11::string::~string((string *)&local_1450);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1400);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_11f8);
  return;
}

Assistant:

IUTEST(ExpressionNot, Comparison)
{
    IUTEST_EXPECT_NOT(f() == 41);
    IUTEST_EXPECT_NOT(f() != 42);
    IUTEST_EXPECT_NOT(f() <= 41);
    IUTEST_EXPECT_NOT(f() >= 43);
    IUTEST_EXPECT_NOT(f() <  40);
    IUTEST_EXPECT_NOT(f() >  50);
    IUTEST_EXPECT_NOT(g() &&  true);
    IUTEST_EXPECT_NOT(g() ||  false);
}